

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O0

void __thiscall Camera::input(Camera *this,string *var,stringstream *fin)

{
  bool bVar1;
  istream *in_RDX;
  char *ctx;
  Camera *in_RDI;
  Vector3 *in_stack_ffffffffffffffd8;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_RDI,(char *)in_stack_ffffffffffffffd8);
  if (bVar1) {
    operator>>((stringstream *)in_RDI,in_stack_ffffffffffffffd8);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_RDI,(char *)in_stack_ffffffffffffffd8);
  if (bVar1) {
    operator>>((stringstream *)in_RDI,in_stack_ffffffffffffffd8);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_RDI,(char *)in_stack_ffffffffffffffd8);
  if (bVar1) {
    operator>>((stringstream *)in_RDI,in_stack_ffffffffffffffd8);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_RDI,(char *)in_stack_ffffffffffffffd8);
  if (bVar1) {
    std::istream::operator>>(in_RDX,&in_RDI->lens_W);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_RDI,(char *)in_stack_ffffffffffffffd8);
  if (bVar1) {
    std::istream::operator>>(in_RDX,&in_RDI->lens_H);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_RDI,(char *)in_stack_ffffffffffffffd8);
  if (bVar1) {
    std::istream::operator>>(in_RDX,&in_RDI->W);
  }
  ctx = "image_H=";
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_RDI,(char *)in_stack_ffffffffffffffd8);
  if (bVar1) {
    ctx = (char *)&in_RDI->H;
    std::istream::operator>>(in_RDX,(int *)ctx);
  }
  init(in_RDI,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

void Camera::input(const std::string &var, std::stringstream &fin) {
    if ( var == "O=" ) fin >> O;
    if ( var == "N=" ) fin >> N;
    if ( var == "Dx=" ) fin >> Dx;
    if ( var == "lens_W=" ) fin >> lens_W;
    if ( var == "lens_H=" ) fin >> lens_H;
    if ( var == "image_W=" ) fin >> W;
    if ( var == "image_H=" ) fin >> H;
    init();
}